

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O1

int __thiscall QSqlTableModelPrivate::insertCount(QSqlTableModelPrivate *this,int maxRow)

{
  QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
  *pQVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  
  pQVar1 = (this->cache).d.d.ptr;
  iVar3 = 0;
  if (pQVar1 == (QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
                 *)0x0) {
    p_Var2 = (_Rb_tree_node_base *)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var4 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<int,_QSqlTableModelPrivate::ModifiedRow,_std::less<int>,_std::allocator<std::pair<const_int,_QSqlTableModelPrivate::ModifiedRow>_>_>_>
                 *)0x0) {
    p_Var4 = (_Rb_tree_node_base *)0x0;
  }
  if (p_Var2 != p_Var4) {
    iVar3 = 0;
    do {
      if ((-1 < maxRow) && (maxRow < (int)p_Var2[1]._M_color)) {
        return iVar3;
      }
      iVar3 = iVar3 + (uint)*(byte *)((long)&p_Var2[2]._M_color + 1);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != p_Var4);
  }
  return iVar3;
}

Assistant:

int QSqlTableModelPrivate::insertCount(int maxRow) const
{
    int cnt = 0;
    CacheMap::ConstIterator i = cache.constBegin();
    const CacheMap::ConstIterator e = cache.constEnd();
    for ( ; i != e && (maxRow < 0 || i.key() <= maxRow); ++i)
        if (i.value().insert())
            ++cnt;

    return cnt;
}